

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qline.cpp
# Opt level: O0

QLineF * QLineF::fromPolar(qreal length,qreal angle)

{
  QLineF *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  qreal angleR;
  double dVar1;
  QLineF *y1pos;
  double x1pos;
  QLineF *this;
  
  this = (QLineF *)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  y1pos = in_RDI;
  x1pos = qDegreesToRadians((double)this);
  dVar1 = qCos<double>(3.18415921497412e-317);
  dVar1 = dVar1 * (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  qSin<double>(3.18417057848398e-317);
  QLineF(this,x1pos,(qreal)y1pos,dVar1,(qreal)in_RDI);
  return y1pos;
}

Assistant:

QLineF QLineF::fromPolar(qreal length, qreal angle)
{
    const qreal angleR = qDegreesToRadians(angle);
    return QLineF(0, 0, qCos(angleR) * length, -qSin(angleR) * length);
}